

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifest_parser_test.cc
# Opt level: O2

void __thiscall ParserTestBrokenInclude::Run(ParserTestBrokenInclude *this)

{
  VirtualFileSystem *this_00;
  Test *pTVar1;
  bool bVar2;
  string err;
  ManifestParser parser;
  allocator<char> local_b1;
  string local_b0;
  string local_90;
  ManifestParser local_70;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"include.ninja",(allocator<char> *)&local_90);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,"build\n",&local_b1);
  this_00 = &(this->super_ParserTest).fs_;
  VirtualFileSystem::Create(this_00,(string *)&local_70,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_70);
  ManifestParser::ManifestParser
            (&local_70,&(this->super_ParserTest).state,(FileReader *)this_00,
             (ManifestParserOptions)0x0);
  pTVar1 = g_current_test;
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  local_b0._M_string_length = 0;
  local_b0.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,"include include.ninja\n",&local_b1);
  bVar2 = ManifestParser::ParseTest(&local_70,&local_90,&local_b0);
  testing::Test::Check
            (pTVar1,!bVar2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/manifest_parser_test.cc"
             ,0x3af,"parser.ParseTest(\"include include.ninja\\n\", &err)");
  std::__cxx11::string::~string((string *)&local_90);
  pTVar1 = g_current_test;
  bVar2 = std::operator==("include.ninja:1: expected path\nbuild\n     ^ near here",&local_b0);
  testing::Test::Check
            (pTVar1,bVar2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/manifest_parser_test.cc"
             ,0x3b3,"\"include.ninja:1: expected path\\n\" \"build\\n\" \"     ^ near here\" == err"
            );
  std::__cxx11::string::~string((string *)&local_b0);
  return;
}

Assistant:

TEST_F(ParserTest, BrokenInclude) {
  fs_.Create("include.ninja", "build\n");
  ManifestParser parser(&state, &fs_);
  string err;
  EXPECT_FALSE(parser.ParseTest("include include.ninja\n", &err));
  EXPECT_EQ("include.ninja:1: expected path\n"
            "build\n"
            "     ^ near here"
            , err);
}